

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseLoop(Parser *this)

{
  bool bVar1;
  bool bVar2;
  RuntimeID RVar3;
  size_t sVar4;
  size_t sVar5;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  String name;
  Variant local_60;
  SymbolType local_38 [6];
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  bVar1 = CheckName(this);
  if (bVar1) {
    local_38[0] = From;
    local_38[1] = Over;
    local_38[2] = Until;
    local_38[3] = While;
    symbols._M_len = 4;
    symbols._M_array = local_38;
    ParseMultiName_abi_cxx11_((String *)&local_60,this,symbols);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (&name,(basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&local_60
              );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&local_60);
    bVar1 = VariableStackFrame::VariableExists(&this->m_variableStackFrame,&name);
    if (bVar1) {
      local_60._0_8_ = name._M_dataplus._M_p;
      Error<char_const*>(this,"Variable name \'%s\' already exists in this scope",(char **)&local_60
                        );
      goto LAB_00129763;
    }
  }
  bVar1 = Accept(this,From);
  if (bVar1) {
    ScopeBegin(this);
    ParseExpression(this);
    if (name._M_string_length != 0) {
      VariableAssign(this,&name);
      EmitOpcode(this,SetVar);
      RVar3 = VariableNameToRuntimeID(this,&name);
      BinaryWriter::Write(&this->m_writer,RVar3);
    }
    Expect(this,To,(char *)0x0);
    ParseExpression(this);
    bVar1 = Accept(this,By);
    if (bVar1) {
      ParseExpression(this);
    }
    else {
      EmitOpcode(this,PushVal);
      local_60._0_8_ = local_60._0_8_ & 0xffffffff00000000;
      Variant::SetNull(&local_60);
      Variant::Write(&local_60,&this->m_writer);
      Variant::~Variant(&local_60);
    }
    Expect(this,NewLine,(char *)0x0);
    sVar4 = (this->m_writer).m_pos;
    ParseBlock(this);
    Expect(this,End,(char *)0x0);
    Expect(this,NewLine,(char *)0x0);
    EmitOpcode(this,LoopCount);
    EmitOpcode(this,JumpTrue);
    BinaryWriter::Write(&this->m_writer,(uint32_t)sVar4);
    ScopeEnd(this);
  }
  else {
    bVar1 = Accept(this,Over);
    if (bVar1) {
      ScopeBegin(this);
      ParseExpression(this);
      bVar1 = Expect(this,NewLine,(char *)0x0);
      if (!bVar1) goto LAB_00129763;
      EmitOpcode(this,PushTop);
      EmitOpcode(this,JumpFalse);
      sVar4 = EmitAddressPlaceholder(this);
      EmitOpcode(this,PushItr);
      if (name._M_string_length != 0) {
        VariableAssign(this,&name);
        EmitOpcode(this,SetVar);
        RVar3 = VariableNameToRuntimeID(this,&name);
        BinaryWriter::Write(&this->m_writer,RVar3);
      }
      sVar5 = (this->m_writer).m_pos;
      ParseBlock(this);
      Expect(this,End,(char *)0x0);
      Expect(this,NewLine,(char *)0x0);
      EmitOpcode(this,LoopOver);
      EmitOpcode(this,JumpFalse);
      BinaryWriter::Write(&this->m_writer,(uint32_t)sVar5);
      EmitAddressBackfill(this,sVar4);
      ScopeEnd(this);
    }
    else {
      bVar1 = Check(this,Until);
      if (!bVar1) {
        bVar1 = Check(this,While);
        if (!bVar1) {
          bVar1 = Accept(this,NewLine);
          if (!bVar1) {
            Error<>(this,"Unknown syntax after loop keyword");
            goto LAB_00129763;
          }
          sVar4 = (this->m_writer).m_pos;
          ParseBlock(this);
          bVar1 = Accept(this,While);
          if (!bVar1) {
            Expect(this,Until,(char *)0x0);
          }
          ParseExpression(this);
          Expect(this,NewLine,(char *)0x0);
          EmitOpcode(this,(uint)bVar1 * 2 + JumpFalse);
          BinaryWriter::Write(&this->m_writer,(uint32_t)sVar4);
          goto LAB_00129747;
        }
      }
      sVar4 = (this->m_writer).m_pos;
      bVar1 = Accept(this,Until);
      if (!bVar1) {
        Expect(this,While,(char *)0x0);
      }
      ParseExpression(this);
      bVar2 = Expect(this,NewLine,(char *)0x0);
      if (!bVar2) goto LAB_00129763;
      EmitOpcode(this,(uint)bVar1 * 2 + JumpFalse);
      sVar5 = EmitAddressPlaceholder(this);
      ParseBlock(this);
      Expect(this,End,(char *)0x0);
      Expect(this,NewLine,(char *)0x0);
      EmitOpcode(this,Jump);
      BinaryWriter::Write(&this->m_writer,(uint32_t)sVar4);
      EmitAddressBackfill(this,sVar5);
    }
  }
LAB_00129747:
  if (this->m_breakAddress != 0) {
    EmitAddressBackfill(this,this->m_breakAddress);
    this->m_breakAddress = 0;
  }
LAB_00129763:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&name);
  return;
}

Assistant:

inline_t void Parser::ParseLoop()
	{
		// Check to see if we're using an explicitly named variable for the loop counter
		String name;
		if (CheckName())
		{
			// Parse initial name part
			name = ParseMultiName({ SymbolType::From, SymbolType::Over, SymbolType::Until, SymbolType::While });

			// Make sure the variable name doesn't already exist
			if (VariableExists(name))
			{
				Error("Variable name '%s' already exists in this scope", name.c_str());
				return;
			}
		}

		// We're looping using a counter
		if (Accept(SymbolType::From))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse from value
			ParseExpression();

			// Assign the counter to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Parse to value
			Expect(SymbolType::To);
			ParseExpression();

			// Parse increment amount
			if (Accept(SymbolType::By))
			{
				ParseExpression();
			}
			else
			{
				EmitOpcode(Opcode::PushVal);
				EmitValue(nullptr);
			}
			Expect(SymbolType::NewLine);

			// Mark where the loop count evaluation has to jump
			auto loopBeginAddress = m_writer.Tell();

			// Evaluate code block inside loop
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Advance counter and evaluate
			EmitOpcode(Opcode::LoopCount);

			// Evaluate result of loop count instruction
			EmitOpcode(Opcode::JumpTrue);
			EmitAddress(loopBeginAddress);

			// End loop scope
			ScopeEnd();
		}
		// We're looping over a collection
		else if (Accept(SymbolType::Over))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse the collection
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Check to see if the collection is empty, and if so, skip the loop
			EmitOpcode(Opcode::PushTop);
			EmitOpcode(Opcode::JumpFalse);
			auto emptyLoopJumpAddress = EmitAddressPlaceholder();

			// Retrieve collection from top of stack and push iterator from beginning position
			EmitOpcode(Opcode::PushItr);

			// Assign the iterator to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Increment iterator and test against collection end
			EmitOpcode(Opcode::LoopOver);
			EmitOpcode(Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);

			// Backfill empty loop jump address
			EmitAddressBackfill(emptyLoopJumpAddress);

			// End loop scope
			ScopeEnd();

		}
		// Loops while a condition is true or false
		else if (Check(SymbolType::Until) || Check(SymbolType::While))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Check for keyword
			bool jumpTrue = Accept(SymbolType::Until);
			if (!jumpTrue)
				Expect(SymbolType::While);

			// Parse the expression to control the loop's jump branch
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Add jump instruction, making sure to store the jump address for later backfilling
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			auto loopJumpAddress = EmitAddressPlaceholder();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Jump to top of loop
			EmitOpcode(Opcode::Jump);
			EmitAddress(loopBeginAddress);

			// Backfill loop jump target address
			EmitAddressBackfill(loopJumpAddress);
		}
		// Executes once and then loops again while a condition is true/false, depending on keyword used
		else if (Accept(SymbolType::NewLine))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the until/while loop block
			ParseBlock();

			// Check the keyword is used
			bool jumpTrue = Accept(SymbolType::While);
			if (!jumpTrue)
				Expect(SymbolType::Until);

			// Parse expression used to determine if loop should execute again
			ParseExpression();
			Expect(SymbolType::NewLine);

			// Conditionally jump to top of loop
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);
		}
		else
		{
			Error("Unknown syntax after loop keyword");
			return;
		}

		// If we used a break somewhere inside the loop, backfill the address now
		if (m_breakAddress)
		{
			EmitAddressBackfill(m_breakAddress);
			m_breakAddress = 0;
		}
	}